

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Transform *
pbrt::Rotate(Transform *__return_storage_ptr__,Float sinTheta,Float cosTheta,Vector3f axis)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int i_1;
  Float (*paFVar8) [4];
  int i;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SquareMatrix<4> m;
  SquareMatrix<4> r;
  
  fVar15 = axis.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._8_56_ = axis._8_56_;
  auVar14._0_8_ = axis.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21 = vmovshdup_avx(auVar14._0_16_);
  fVar13 = axis.super_Tuple3<pbrt::Vector3,_float>.x;
  paFVar8 = (Float (*) [4])&m;
  lVar9 = 0;
  fVar18 = auVar21._0_4_;
  auVar17 = ZEXT416((uint)(fVar15 * fVar15 + fVar13 * fVar13 + fVar18 * fVar18));
  auVar17 = vsqrtss_avx(auVar17,auVar17);
  auVar11 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  fVar19 = auVar17._0_4_;
  auVar17._0_4_ = fVar18 / fVar19;
  auVar17._4_12_ = auVar21._4_12_;
  do {
    auVar10 = vpbroadcastq_avx512vl();
    lVar9 = lVar9 + 1;
    uVar1 = vpcmpeqq_avx512vl(auVar10,auVar11);
    auVar21 = vpmovm2d_avx512vl(uVar1 & 0xf);
    auVar21 = vpsrld_avx(auVar21,0x1f);
    auVar21 = vcvtdq2ps_avx(auVar21);
    *paFVar8 = (Float  [4])auVar21;
    paFVar8 = paFVar8 + 1;
  } while (lVar9 != 4);
  auVar12._0_4_ = fVar13 / fVar19;
  auVar12._4_12_ = auVar14._4_12_;
  auVar16._0_4_ = fVar15 / fVar19;
  auVar16._4_12_ = axis._12_12_;
  lVar9 = 0;
  paFVar8 = (Float (*) [4])&r;
  fVar13 = 1.0 - cosTheta;
  auVar20 = SUB6416(ZEXT464(0x3f800000),0);
  auVar6 = vfnmadd213ss_fma(auVar12,auVar12,auVar20);
  auVar21 = vfmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)(auVar12._0_4_ * auVar16._0_4_)),
                            ZEXT416((uint)(auVar17._0_4_ * sinTheta)));
  auVar22 = ZEXT416((uint)fVar13);
  auVar3 = vfmsub213ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar16._0_4_)),auVar22,
                           ZEXT416((uint)(auVar17._0_4_ * sinTheta)));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * cosTheta)),auVar12,auVar12);
  auVar4 = vfmsub213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)(auVar12._0_4_ * auVar17._0_4_)),
                           ZEXT416((uint)(auVar16._0_4_ * sinTheta)));
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar17._0_4_)),auVar22,
                           ZEXT416((uint)(auVar16._0_4_ * sinTheta)));
  auVar7 = vfnmadd213ss_fma(auVar17,auVar17,auVar20);
  auVar20 = vfnmadd231ss_fma(auVar20,auVar16,auVar16);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * cosTheta)),auVar17,auVar17);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * cosTheta)),auVar16,auVar16);
  auVar5 = vfmsub213ss_fma(auVar22,ZEXT416((uint)(auVar17._0_4_ * auVar16._0_4_)),
                           ZEXT416((uint)(auVar12._0_4_ * sinTheta)));
  auVar17 = vfmadd213ss_fma(auVar22,ZEXT416((uint)(auVar17._0_4_ * auVar16._0_4_)),
                            ZEXT416((uint)(auVar12._0_4_ * sinTheta)));
  do {
    auVar10 = vpbroadcastq_avx512vl();
    lVar9 = lVar9 + 1;
    uVar1 = vpcmpeqq_avx512vl(auVar10,auVar11);
    auVar12 = vpmovm2d_avx512vl(uVar1 & 0xf);
    auVar12 = vpsrld_avx(auVar12,0x1f);
    auVar12 = vcvtdq2ps_avx(auVar12);
    *paFVar8 = (Float  [4])auVar12;
    paFVar8 = paFVar8 + 1;
  } while (lVar9 != 4);
  lVar9 = 0;
  auVar11 = vpbroadcastq_avx512vl();
  auVar11 = vpaddq_avx2(auVar11,_DAT_003eeca0);
  paFVar8 = (Float (*) [4])&r;
  do {
    auVar10 = vpbroadcastq_avx512vl();
    lVar9 = lVar9 + 1;
    auVar10 = vpsllq_avx2(auVar10,2);
    vpaddq_avx2(auVar11,auVar10);
    auVar12 = vgatherqps_avx512vl(*(undefined8 *)*(Float (*) [4])*paFVar8);
    *paFVar8 = (Float  [4])auVar12;
    paFVar8 = paFVar8 + 1;
  } while (lVar9 != 4);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(auVar4._0_4_,auVar2._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = (ulong)auVar21._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(auVar7._0_4_,auVar6._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = (ulong)auVar5._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(auVar17._0_4_,auVar3._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = (ulong)auVar20._0_4_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = m.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = r.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = r.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = r.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = r.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = r.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = r.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = r.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = r.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline T LengthSquared(const Vector3<T> &v) {
    return Sqr(v.x) + Sqr(v.y) + Sqr(v.z);
}